

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

element * __thiscall MinVR::element::operator=(element *this,element *the_element)

{
  pointer pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long *local_58;
  long local_50;
  long local_48 [2];
  _List_node_base local_38;
  
  set_name(this,the_element->m_name);
  pcVar1 = (the_element->m_value)._M_dataplus._M_p;
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (the_element->m_value)._M_string_length);
  if (local_50 != 0) {
    std::__cxx11::string::_M_assign((string *)&this->m_value);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::list
            ((list<MinVR::element_*,_std::allocator<MinVR::element_*>_> *)&local_38,
             &the_element->m_element_list);
  std::__cxx11::list<MinVR::element_*,_std::allocator<MinVR::element_*>_>::_M_move_assign
            (&this->m_element_list,&local_38);
  p_Var3 = local_38._M_next;
  while (p_Var3 != &local_38) {
    p_Var2 = (((_List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)
              &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::list
            ((list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *)&local_38,
             &the_element->m_attribute_list);
  std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::_M_move_assign
            (&this->m_attribute_list,&local_38);
  while (local_38._M_next != &local_38) {
    p_Var3 = (local_38._M_next)->_M_next;
    operator_delete(local_38._M_next,0x18);
    local_38._M_next = p_Var3;
  }
  return this;
}

Assistant:

element* element::operator = ( element* the_element)
{
    set_name(the_element->get_name());
    set_value(the_element->get_value());
    m_element_list = the_element->get_element_list();
    m_attribute_list = the_element->get_attribute_list();
    return this;
}